

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kalaha.h
# Opt level: O3

void __thiscall KalahaState<(short)6>::check_invariant(KalahaState<(short)6> *this)

{
  short sVar1;
  short sVar2;
  short sVar3;
  long lVar4;
  
  sVar2 = this->player1_store;
  lVar4 = -0xc;
  do {
    sVar3 = *(short *)((long)this->player2_bins + lVar4);
    if (sVar3 < 0) {
      MCTS::assertion_failed
                ("seed >= 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/PetterS[P]monte-carlo-tree-search/games/kalaha.h"
                 ,0x107);
    }
    sVar2 = sVar3 + sVar2;
    lVar4 = lVar4 + 2;
  } while (lVar4 != 0);
  sVar3 = this->player2_store;
  lVar4 = -0xc;
  do {
    sVar1 = *(short *)((long)this->player2_bins + lVar4 + 0xc);
    if (sVar1 < 0) {
      MCTS::assertion_failed
                ("seed >= 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/PetterS[P]monte-carlo-tree-search/games/kalaha.h"
                 ,0x10d);
    }
    sVar3 = sVar1 + sVar3;
    lVar4 = lVar4 + 2;
  } while (lVar4 != 0);
  if ((int)sVar3 + (int)sVar2 == this->start_seeds * 0xc) {
    return;
  }
  MCTS::assertion_failed
            ("player1_sum + player2_sum == (num_bins * 2) * start_seeds",
             "/workspace/llm4binary/github/license_c_cmakelists/PetterS[P]monte-carlo-tree-search/games/kalaha.h"
             ,0x10f);
}

Assistant:

void check_invariant() const
	{
		short player1_sum = player1_store;
		for (auto seed: player1_bins) {
			player1_sum += seed;
			attest(seed >= 0);
		}

		short player2_sum = player2_store;
		for (auto seed: player2_bins) {
			player2_sum += seed;
			attest(seed >= 0);
		}
		attest(player1_sum + player2_sum == (num_bins * 2) * start_seeds);
	}